

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

int allphone_search_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  logmath_t *lmath;
  int iVar1;
  double p;
  
  ps_search_base_reinit(search,dict,d2p);
  if (search[1].type == (char *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x273,"-lm argument missing; doing unconstrained phone-loop decoding\n");
    lmath = search->acmod->lmath;
    p = ps_config_float(search->config,"pip");
    iVar1 = logmath_log(lmath,(float64)p);
    *(int *)((long)&search[1].dict + 4) = iVar1 * *(int *)&search[1].dict >> 10;
  }
  return 0;
}

Assistant:

int
allphone_search_reinit(ps_search_t * search, dict_t * dict,
                       dict2pid_t * d2p)
{
    allphone_search_t *allphs = (allphone_search_t *) search;

    /* Free old dict2pid, dict */
    ps_search_base_reinit(search, dict, d2p);

    if (!allphs->lm) {
        E_WARN
            ("-lm argument missing; doing unconstrained phone-loop decoding\n");
        allphs->inspen =
            (int32) (logmath_log
                     (search->acmod->lmath,
                      ps_config_float(search->config, "pip"))
                     * allphs->lw) >> SENSCR_SHIFT;
    }

    return 0;
}